

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix2f> *value)

{
  bool bVar1;
  matrix2f local_28;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    local_28.m[0][0] = 1.0;
    local_28.m[0][1] = 0.0;
    local_28.m[1][0] = 0.0;
    local_28.m[1][1] = 1.0;
    bVar1 = ParseMatrix(this,&local_28);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix2f>::operator=(value,&local_28);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix2f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix2f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}